

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::BufferStorage::ErrorsTest::iterate(ErrorsTest *this)

{
  GLenum target;
  int iVar1;
  undefined4 extraout_var;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar2;
  bool test_result;
  string message;
  code *local_60;
  GLenum local_58;
  string local_50;
  Functions *gl;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar1);
  test_result = true;
  BufferStorage::Buffer::LoadExtDirectStateAccess((this->super_TestCase).m_context);
  if (m_direct_state_access_support == 0) {
    this_00 = ((this->super_TestCase).m_context)->m_testCtx;
    description = "Unsupported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  else {
    for (lVar2 = 0; lVar2 != 0x34; lVar2 = lVar2 + 4) {
      target = *(GLenum *)((long)&BufferStorage::Buffer::m_targets + lVar2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&message,"BufferStorage was executed for id 0, target: ",
                 (allocator<char> *)&local_50);
      local_60 = glu::getBufferTargetName;
      local_58 = target;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_50,&local_60);
      std::__cxx11::string::append((char *)&message);
      std::__cxx11::string::~string((string *)&local_50);
      BufferStorage::Buffer::Bind(gl,0,target);
      (*gl->bufferStorage)(target,0,(void *)0x0,0x100);
      verifyError(this,0x502,
                  (GLchar *)
                  CONCAT44(message._M_dataplus._M_p._4_4_,(GLuint)message._M_dataplus._M_p),
                  &test_result);
      std::__cxx11::string::~string((string *)&message);
    }
    message._M_string_length = (size_type)(this->super_TestCase).m_context;
    message._M_dataplus._M_p._0_4_ = 0xffffffff;
    message.field_2._M_allocated_capacity._0_4_ = 0x8892;
    BufferStorage::Buffer::InitStorage((Buffer *)&message,0x8892,0x100,0x20,iterate::data);
    if (gl->namedBufferStorage != (glNamedBufferStorageFunc)0x0) {
      (*gl->namedBufferStorage)((GLuint)message._M_dataplus._M_p,0x20,iterate::data,0x100);
      verifyError(this,0x502,"NamedBufferStorage was executed for id with immutable storage",
                  &test_result);
    }
    BufferStorage::Buffer::Bind(gl,(GLuint)message._M_dataplus._M_p,0x8892);
    (*gl->bufferStorage)(0x8892,0x20,iterate::data,0x100);
    verifyError(this,0x502,"BufferStorage was executed for target with immutable storage",
                &test_result);
    BufferStorage::Buffer::Bind(gl,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&message);
    message._M_string_length = (size_type)(this->super_TestCase).m_context;
    message._M_dataplus._M_p._0_4_ = 0xffffffff;
    message.field_2._M_allocated_capacity._0_4_ = 0x8892;
    (*gl->createBuffers)(1,(GLuint *)&message);
    if (gl->namedBufferStorage != (glNamedBufferStorageFunc)0x0) {
      (*gl->namedBufferStorage)((GLuint)message._M_dataplus._M_p,0,iterate()::data,0x100);
      verifyError(this,0x501,"NamedBufferStorage was executed with size == 0",&test_result);
      (*gl->namedBufferStorage)((GLuint)message._M_dataplus._M_p,-0x10,iterate()::data,0x100);
      verifyError(this,0x501,"NamedBufferStorage was executed with size == -16",&test_result);
    }
    BufferStorage::Buffer::Bind(gl,(GLuint)message._M_dataplus._M_p,0x8892);
    (*gl->bufferStorage)(0x8892,0,iterate()::data,0x100);
    verifyError(this,0x501,"BufferStorage was executed with size == 0",&test_result);
    (*gl->bufferStorage)(0x8892,-0x10,iterate()::data,0x100);
    verifyError(this,0x501,"BufferStorage was executed with size == -16",&test_result);
    BufferStorage::Buffer::Bind(gl,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&message);
    message._M_string_length = (size_type)(this->super_TestCase).m_context;
    message._M_dataplus._M_p._0_4_ = 0xffffffff;
    message.field_2._M_allocated_capacity._0_4_ = 0x8892;
    (*gl->createBuffers)(1,(GLuint *)&message);
    if (gl->namedBufferStorage != (glNamedBufferStorageFunc)0x0) {
      (*gl->namedBufferStorage)((GLuint)message._M_dataplus._M_p,0x20,iterate()::data,0x40);
      verifyError(this,0x501,"NamedBufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
                  &test_result);
    }
    BufferStorage::Buffer::Bind(gl,(GLuint)message._M_dataplus._M_p,0x8892);
    (*gl->bufferStorage)(0x8892,0x20,iterate()::data,0x40);
    verifyError(this,0x501,"BufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
                &test_result);
    BufferStorage::Buffer::Bind(gl,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&message);
    message._M_string_length = (size_type)(this->super_TestCase).m_context;
    message._M_dataplus._M_p._0_4_ = 0xffffffff;
    message.field_2._M_allocated_capacity._0_4_ = 0x8892;
    (*gl->createBuffers)(1,(GLuint *)&message);
    if (gl->namedBufferStorage != (glNamedBufferStorageFunc)0x0) {
      (*gl->namedBufferStorage)((GLuint)message._M_dataplus._M_p,0x20,iterate()::data,0x80);
      verifyError(this,0x501,"NamedBufferStorage was executed with flags == GL_MAP_COHERENT_BIT",
                  &test_result);
    }
    BufferStorage::Buffer::Bind(gl,(GLuint)message._M_dataplus._M_p,0x8892);
    (*gl->bufferStorage)(0x8892,0x20,iterate()::data,0x80);
    verifyError(this,0x501,"BufferStorage was executed with flags == GL_MAP_COHERENT_BIT",
                &test_result);
    BufferStorage::Buffer::Bind(gl,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&message);
    message._M_string_length = (size_type)(this->super_TestCase).m_context;
    message._M_dataplus._M_p._0_4_ = 0xffffffff;
    message.field_2._M_allocated_capacity._0_4_ = 0x8892;
    BufferStorage::Buffer::InitStorage((Buffer *)&message,0x8892,0x100,0x20,iterate()::data);
    if (gl->mapNamedBufferRange != (glMapNamedBufferRangeFunc)0x0) {
      (*gl->mapNamedBufferRange)((GLuint)message._M_dataplus._M_p,0,0x20,1);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,&test_result);
      (*gl->mapNamedBufferRange)((GLuint)message._M_dataplus._M_p,0,0x20,2);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,&test_result);
      (*gl->mapNamedBufferRange)((GLuint)message._M_dataplus._M_p,0,0x20,0x40);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,&test_result);
      (*gl->mapNamedBufferRange)((GLuint)message._M_dataplus._M_p,0,0x20,0x80);
      verifyError(this,0x502,
                  "MapNamedBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                  ,&test_result);
    }
    BufferStorage::Buffer::Bind(gl,(GLuint)message._M_dataplus._M_p,0x8892);
    (*gl->mapBufferRange)(0x8892,0,0x20,1);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,&test_result);
    (*gl->mapBufferRange)(0x8892,0,0x20,2);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,&test_result);
    (*gl->mapBufferRange)(0x8892,0,0x20,0x40);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,&test_result);
    (*gl->mapBufferRange)(0x8892,0,0x20,0x80);
    verifyError(this,0x502,
                "MapBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT"
                ,&test_result);
    BufferStorage::Buffer::Bind(gl,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&message);
    message._M_string_length = (size_type)(this->super_TestCase).m_context;
    message._M_dataplus._M_p._0_4_ = 0xffffffff;
    message.field_2._M_allocated_capacity._0_4_ = 0x8892;
    BufferStorage::Buffer::InitStorage((Buffer *)&message,0x8892,0x43,0x20,iterate()::data);
    if (gl->namedBufferSubData != (glNamedBufferSubDataFunc)0x0) {
      (*gl->namedBufferSubData)((GLuint)message._M_dataplus._M_p,0,0x20,iterate()::data);
      verifyError(this,0x502,
                  "NamedBufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
                  &test_result);
    }
    BufferStorage::Buffer::Bind(gl,(GLuint)message._M_dataplus._M_p,0x8892);
    (*gl->bufferSubData)(0x8892,0,0x20,iterate()::data);
    verifyError(this,0x502,"BufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
                &test_result);
    BufferStorage::Buffer::Bind(gl,0,0x8892);
    BufferStorage::Buffer::~Buffer((Buffer *)&message);
    this_00 = ((this->super_TestCase).m_context)->m_testCtx;
    if (test_result == true) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	bool test_result = true;

	Buffer::LoadExtDirectStateAccess(m_context);

	// No GL45 or GL_ARB_direct_state_access support
	if (m_direct_state_access_support == FUNCTIONALITY_SUPPORT_NONE)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Unsupported");
		return tcu::TestNode::STOP;
	}

	/*
	 * - INVALID_OPERATION is generated by BufferStorage when 0 is bound to
	 * <target>; Check all targets;
	 */
	for (GLuint i = 0; i < Buffer::m_n_targets; ++i)
	{
		const GLenum target  = Buffer::m_targets[i];
		std::string  message = "BufferStorage was executed for id 0, target: ";

		message.append(glu::getBufferTargetStr(target).toString().c_str());

		Buffer::Bind(gl, 0 /* id */, target);
		gl.bufferStorage(target, 0 /* size */, 0 /* data */, GL_DYNAMIC_STORAGE_BIT /* flags */);

		verifyError(GL_INVALID_OPERATION, message.c_str(), test_result);
	}

	/*
	 * - INVLIAD_OPERATION is generated by BufferStorage, NamedBufferStorage and
	 * BufferData if buffer already have immutable store;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, data);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_OPERATION, "NamedBufferStorage was executed for id with immutable storage",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_OPERATION, "BufferStorage was executed for target with immutable storage", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <size> is less or equal to zero;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, 0 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with size == 0", test_result);

			gl.namedBufferStorage(buffer.m_id, -16 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with size == -16", test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, 0 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with size == 0", test_result);

		gl.bufferStorage(GL_ARRAY_BUFFER, -16 /* size */, data, GL_DYNAMIC_STORAGE_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with size == -16", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVLAID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <flags> contains MAP_PERSISTENT_BIT and neither MAP_READ_BIT nor
	 * MAP_WRITE_BIT;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_MAP_PERSISTENT_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_MAP_PERSISTENT_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with flags == GL_MAP_PERSISTENT_BIT", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_VALUE is generated by BufferStorage and NamedBufferStorage when
	 * <flags> contains MAP_COHERENT_BIT and no MAP_PERSISTENT_BIT;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		gl.createBuffers(1, &buffer.m_id);

		/* NamedBufferStorage */
		if (0 != gl.namedBufferStorage)
		{
			gl.namedBufferStorage(buffer.m_id, data_size, data, GL_MAP_COHERENT_BIT);
			verifyError(GL_INVALID_VALUE, "NamedBufferStorage was executed with flags == GL_MAP_COHERENT_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferStorage(GL_ARRAY_BUFFER, data_size, data, GL_MAP_COHERENT_BIT);
		verifyError(GL_INVALID_VALUE, "BufferStorage was executed with flags == GL_MAP_COHERENT_BIT", test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_OPERATION is generated by MapBufferRange if any of:
	 *   * MAP_COHERENT_BIT,
	 *   * MAP_PERSISTENT_BIT,
	 *   * MAP_READ_BIT,
	 *   * MAP_WRITE_BIT
	 * is included in <access> and not in buffer's storage flags;
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_DYNAMIC_STORAGE_BIT, data_size, data);

		/* MapNamedBufferRange */
		if (0 != gl.mapNamedBufferRange)
		{
			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_READ_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_READ_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_WRITE_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_WRITE_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);

			gl.mapNamedBufferRange(buffer.m_id, 0 /* offset */, data_size, GL_MAP_COHERENT_BIT);
			verifyError(GL_INVALID_OPERATION, "MapNamedBufferRange was executed with access == GL_MAP_COHERENT_BIT, "
											  "storage flags == GL_DYNAMIC_STORAGE_BIT",
						test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_READ_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_READ_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_WRITE_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_WRITE_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_PERSISTENT_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_PERSISTENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		gl.mapBufferRange(GL_ARRAY_BUFFER, 0 /* offset */, data_size, GL_MAP_COHERENT_BIT);
		verifyError(
			GL_INVALID_OPERATION,
			"MapBufferRange was executed with access == GL_MAP_COHERENT_BIT, storage flags == GL_DYNAMIC_STORAGE_BIT",
			test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/*
	 * - INVALID_OPERATION is generated by BufferSubData and NamedBufferSubData
	 * when buffer has immutable store but its flags does not include
	 * DYNAMIC_STORAGE.
	 */
	{
		static const GLsizeiptr data_size = 32;
		static GLubyte			data[data_size];

		Buffer buffer(m_context);
		buffer.InitStorage(GL_ARRAY_BUFFER, GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_MAP_PERSISTENT_BIT, data_size,
						   data);

		/* NamedBufferSubData */
		if (0 != gl.namedBufferSubData)
		{
			gl.namedBufferSubData(buffer.m_id, 0 /* offset */, data_size, data);
			verifyError(GL_INVALID_OPERATION,
						"NamedBufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT", test_result);
		}

		/* BufferStorage */
		Buffer::Bind(gl, buffer.m_id, GL_ARRAY_BUFFER);

		gl.bufferSubData(GL_ARRAY_BUFFER, 0 /* offset */, data_size, data);
		verifyError(GL_INVALID_OPERATION, "BufferSubData was executed for storage without GL_DYNAMIC_STORAGE_BIT",
					test_result);

		Buffer::Bind(gl, 0, GL_ARRAY_BUFFER);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}